

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msc.h
# Opt level: O0

vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_> * __thiscall
msc::
cluster_shifted<double,__gnu_cxx::__normal_iterator<std::vector<double,std::allocator<double>>const*,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>,msc::metrics::L2Sq>
          (double param_1,
          vector<msc::Cluster<double>,std::allocator<msc::Cluster<double>>> *__return_storage_ptr__,
          msc *this,vector<double,_std::allocator<double>_> *first,int param_5)

{
  size_t a;
  bool bVar1;
  invalid_argument *this_00;
  reference point;
  size_type sVar2;
  reference pvVar3;
  double *b;
  double dVar4;
  ulong local_60;
  size_t c;
  double *pt;
  __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  it;
  size_t i;
  double epsilon_local;
  int dim_local;
  __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  last_local;
  __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  first_local;
  vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_> *clusters;
  
  epsilon_local._0_4_ = param_5;
  _dim_local = first;
  last_local._M_current = (vector<double,_std::allocator<double>_> *)this;
  if (param_5 < 1) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Dimension must be greater than 0");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_>::vector
            ((vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_> *)
             __return_storage_ptr__);
  it._M_current = (vector<double,_std::allocator<double>_> *)0x0;
  pt = (double *)last_local._M_current;
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                        *)&pt,(__normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                               *)&dim_local);
    if (!bVar1) {
      return (vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_> *)
             __return_storage_ptr__;
    }
    point = __gnu_cxx::
            __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
            ::operator*((__normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                         *)&pt);
    c = (size_t)Accessor<double,_std::vector<double,_std::allocator<double>_>_>::data(point);
    for (local_60 = 0;
        sVar2 = std::vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_>::size
                          ((vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_> *)
                           __return_storage_ptr__), a = c, local_60 < sVar2; local_60 = local_60 + 1
        ) {
      pvVar3 = std::vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_>::operator[]
                         ((vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_> *)
                          __return_storage_ptr__,local_60);
      b = std::vector<double,_std::allocator<double>_>::data(&pvVar3->mode);
      dVar4 = metrics::L2Sq::operator()
                        ((L2Sq *)((long)&epsilon_local + 7),(double *)a,b,epsilon_local._0_4_);
      if (dVar4 <= param_1) break;
    }
    sVar2 = std::vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_>::size
                      ((vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_> *)
                       __return_storage_ptr__);
    if (local_60 == sVar2) {
      std::vector<msc::Cluster<double>,std::allocator<msc::Cluster<double>>>::
      emplace_back<double_const*&,int&>(__return_storage_ptr__,(double **)&c,(int *)&epsilon_local);
    }
    pvVar3 = std::vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_>::operator[]
                       ((vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_> *)
                        __return_storage_ptr__,local_60);
    std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&pvVar3->members,
               (unsigned_long *)&it);
    __gnu_cxx::
    __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
    ::operator++((__normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                  *)&pt,0);
    it._M_current =
         (vector<double,_std::allocator<double>_> *)
         ((long)&((it._M_current)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start + 1);
  } while( true );
}

Assistant:

inline std::vector<Cluster<T>> cluster_shifted(
    InputIterator first, InputIterator last, int dim, Metric metric,
    double epsilon = std::numeric_limits<float>::epsilon())
{
    if (dim <= 0)
        throw std::invalid_argument("Dimension must be greater than 0");
    typedef typename std::iterator_traits<InputIterator>::value_type C;
    std::vector<Cluster<T>> clusters;
    std::size_t i = 0;
    for (auto it = first; it != last; it++, i++)
    {
        const T* pt = Accessor<T, C>::data(*it);
        std::size_t c = 0;
        for (; c < clusters.size(); c++)
            if (metric(pt, clusters[c].mode.data(), dim) <= epsilon)
                break;
        if (c == clusters.size())
            clusters.emplace_back(pt, dim);
        clusters[c].members.emplace_back(i);
    }

    return clusters;
}